

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O0

void __thiscall wasm::ReorderFunctions::~ReorderFunctions(ReorderFunctions *this)

{
  ReorderFunctions *this_local;
  
  ~ReorderFunctions(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

bool requiresNonNullableLocalFixups() override { return false; }